

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_writer.c
# Opt level: O1

adt_str_t * dtl_json_dumps(dtl_dv_t *dv,int32_t indent,_Bool sortKeys)

{
  adt_str_t *paVar1;
  dtl_json_writer_t writer;
  dtl_json_writer_t local_58;
  
  local_58.outputType = '\0';
  local_58.indentWidth = 0;
  local_58.currentIndent = 0;
  local_58.indentArray = (adt_bytearray_t *)0x0;
  local_58.destStr = adt_str_new();
  local_58.destFile = (FILE *)0x0;
  local_58.sortKeys = false;
  local_58.newLineStr = "\n";
  if ((0 < indent) &&
     (local_58.indentWidth = indent, local_58.indentArray == (adt_bytearray_t *)0x0)) {
    local_58.indentArray = adt_bytearray_new(0x80);
  }
  if (sortKeys) {
    local_58.sortKeys = true;
  }
  dtl_json_writer_write_dv(&local_58,dv,true);
  paVar1 = local_58.destStr;
  if (local_58.indentArray != (adt_bytearray_t *)0x0) {
    adt_bytearray_delete(local_58.indentArray);
  }
  return paVar1;
}

Assistant:

adt_str_t* dtl_json_dumps(const dtl_dv_t *dv, int32_t indent, bool sortKeys)
{
   adt_str_t *retval = (adt_str_t*) 0;
   dtl_json_writer_t writer;
   dtl_json_writer_createWithString(&writer);
   if (indent > 0)
   {
      dtl_json_writer_setIndentWidth(&writer, indent);
   }
   if (sortKeys)
   {
      dtl_json_writer_setSortKeys(&writer, true);
   }
   dtl_json_writer_write_dv(&writer, dv, true);
   retval = writer.destStr;
   dtl_json_writer_destroy(&writer, true);
   return retval;
}